

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_int>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
               *this,GetterYs<unsigned_int> *getter1,GetterYRef *getter2,
              TransformerLinLin *transformer,ImU32 col)

{
  int iVar1;
  ImVec2 IVar2;
  ImPlotContext *pIVar3;
  int iVar4;
  ImPlotContext *gp;
  ImVec2 IVar5;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar1 = getter1->Count;
  iVar4 = getter2->Count;
  if (iVar1 < getter2->Count) {
    iVar4 = iVar1;
  }
  this->Prims = iVar4 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar3 = GImPlot;
  (this->P12).y = 0.0;
  iVar4 = transformer->YAxis;
  IVar5.x = (float)(((getter1->XScale * 0.0 + getter1->X0) - (GImPlot->CurrentPlot->XAxis).Range.Min
                    ) * GImPlot->Mx + (double)GImPlot->PixelRange[iVar4].Min.x);
  IVar5.y = (float)(((double)*(uint *)((long)getter1->Ys +
                                      (long)((getter1->Offset % iVar1 + iVar1) % iVar1) *
                                      (long)getter1->Stride) -
                    GImPlot->CurrentPlot->YAxis[iVar4].Range.Min) * GImPlot->My[iVar4] +
                   (double)GImPlot->PixelRange[iVar4].Min.y);
  this->P11 = IVar5;
  iVar1 = transformer->YAxis;
  IVar2.y = (float)((getter2->YRef - pIVar3->CurrentPlot->YAxis[iVar1].Range.Min) *
                    pIVar3->My[iVar1] + (double)pIVar3->PixelRange[iVar1].Min.y);
  IVar2.x = (float)(((getter2->XScale * 0.0 + getter2->X0) - (pIVar3->CurrentPlot->XAxis).Range.Min)
                    * pIVar3->Mx + (double)pIVar3->PixelRange[iVar1].Min.x);
  this->P12 = IVar2;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }